

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

UpsampleLayerParams * __thiscall
CoreML::Specification::UpsampleLayerParams::New(UpsampleLayerParams *this,Arena *arena)

{
  UpsampleLayerParams *this_00;
  UpsampleLayerParams *n;
  Arena *arena_local;
  UpsampleLayerParams *this_local;
  
  this_00 = (UpsampleLayerParams *)operator_new(0x48);
  UpsampleLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::UpsampleLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

UpsampleLayerParams* UpsampleLayerParams::New(::google::protobuf::Arena* arena) const {
  UpsampleLayerParams* n = new UpsampleLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}